

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_window_is_any_hovered(nk_context *ctx)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  nk_window *pnVar11;
  nk_window *pnVar12;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x49bf,"int nk_window_is_any_hovered(struct nk_context *)");
  }
  pnVar12 = ctx->begin;
  do {
    if (pnVar12 == (nk_window *)0x0) {
      return 0;
    }
    if ((pnVar12->flags >> 0xd & 1) == 0) {
      if (((pnVar12->popup).active != 0) &&
         (pnVar11 = (pnVar12->popup).win, pnVar11 != (nk_window *)0x0)) {
        uVar3 = (pnVar11->bounds).x;
        uVar7 = (pnVar11->bounds).y;
        fVar1 = (ctx->input).mouse.pos.x;
        if (((float)uVar3 <= fVar1) &&
           (uVar4 = (pnVar11->bounds).w, uVar8 = (pnVar11->bounds).h,
           fVar1 < (float)uVar3 + (float)uVar4)) {
          fVar1 = (ctx->input).mouse.pos.y;
          if (((float)uVar7 <= fVar1) && (fVar1 < (float)uVar7 + (float)uVar8)) {
            return 1;
          }
        }
      }
      uVar5 = (pnVar12->bounds).x;
      uVar9 = (pnVar12->bounds).y;
      uVar6 = (pnVar12->bounds).w;
      uVar10 = (pnVar12->bounds).h;
      if ((short)pnVar12->flags < 0) {
        fVar1 = (ctx->input).mouse.pos.x;
        if (((((float)uVar5 <= fVar1) && (fVar1 < (float)uVar5 + (float)uVar6)) &&
            (fVar1 = (ctx->input).mouse.pos.y, (float)uVar9 <= fVar1)) &&
           (fVar2 = (ctx->style).window.header.padding.y,
           fVar1 < (float)uVar9 + fVar2 + fVar2 + ((ctx->style).font)->height)) {
          return 1;
        }
      }
      else {
        fVar1 = (ctx->input).mouse.pos.x;
        if ((((float)uVar5 <= fVar1) && (fVar1 < (float)uVar5 + (float)uVar6)) &&
           ((fVar1 = (ctx->input).mouse.pos.y, (float)uVar9 <= fVar1 &&
            (fVar1 < (float)uVar9 + (float)uVar10)))) {
          return 1;
        }
      }
    }
    pnVar12 = pnVar12->next;
  } while( true );
}

Assistant:

NK_API int
nk_window_is_any_hovered(struct nk_context *ctx)
{
    struct nk_window *iter;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    iter = ctx->begin;
    while (iter) {
        /* check if window is being hovered */
        if(!(iter->flags & NK_WINDOW_HIDDEN)) {
            /* check if window popup is being hovered */
            if (iter->popup.active && iter->popup.win && nk_input_is_mouse_hovering_rect(&ctx->input, iter->popup.win->bounds))
                return 1;

            if (iter->flags & NK_WINDOW_MINIMIZED) {
                struct nk_rect header = iter->bounds;
                header.h = ctx->style.font->height + 2 * ctx->style.window.header.padding.y;
                if (nk_input_is_mouse_hovering_rect(&ctx->input, header))
                    return 1;
            } else if (nk_input_is_mouse_hovering_rect(&ctx->input, iter->bounds)) {
                return 1;
            }
        }
        iter = iter->next;
    }
    return 0;
}